

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_tet_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  REF_DBL norm3 [3];
  REF_DBL norm2 [3];
  REF_DBL norm1 [3];
  REF_INT local_b0;
  undefined4 uStack_ac;
  REF_INT RStack_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  undefined8 uStack_30;
  
  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  uVar6 = ref_node_tet_vol(ref_node,nodes,&local_a0);
  if (uVar6 == 0) {
    local_38 = local_a0;
    uStack_30 = 0;
    local_b0 = *nodes;
    RStack_a8 = (REF_INT)*(undefined8 *)(nodes + 2);
    uStack_ac = (undefined4)((ulong)*(undefined8 *)(nodes + 2) >> 0x20);
    uVar6 = ref_node_tri_normal(ref_node,&local_b0,&local_58);
    if (uVar6 == 0) {
      local_b0 = (REF_INT)*(undefined8 *)nodes;
      uStack_ac = (undefined4)((ulong)*(undefined8 *)nodes >> 0x20);
      RStack_a8 = nodes[3];
      uVar6 = ref_node_tri_normal(ref_node,&local_b0,&local_78);
      if (uVar6 == 0) {
        local_b0 = *nodes;
        RStack_a8 = (REF_INT)*(undefined8 *)(nodes + 1);
        uStack_ac = (undefined4)((ulong)*(undefined8 *)(nodes + 1) >> 0x20);
        uVar6 = ref_node_tri_normal(ref_node,&local_b0,&local_98);
        if (uVar6 == 0) {
          local_38 = local_38 * -6.0;
          iVar1 = nodes[1];
          iVar2 = *nodes;
          dVar9 = scalar[iVar2];
          iVar3 = nodes[2];
          iVar4 = nodes[3];
          auVar8._0_8_ = (scalar[iVar4] - dVar9) * local_98 +
                         (scalar[iVar1] - dVar9) * local_58 + (scalar[iVar3] - dVar9) * local_78;
          *gradient = auVar8._0_8_;
          dVar9 = scalar[iVar2];
          dVar9 = (scalar[iVar4] - dVar9) * local_90 +
                  (scalar[iVar3] - dVar9) * local_70 + (scalar[iVar1] - dVar9) * local_50;
          gradient[1] = dVar9;
          auVar11._0_8_ = local_38 * 1e+20;
          auVar11._8_8_ = auVar8._0_8_;
          auVar12._8_8_ = -auVar8._0_8_;
          auVar12._0_8_ = -auVar11._0_8_;
          auVar12 = maxpd(auVar11,auVar12);
          dVar10 = auVar12._0_8_;
          if (auVar12._8_8_ < dVar10) {
            dVar14 = dVar9;
            if (dVar9 <= -dVar9) {
              dVar14 = -dVar9;
            }
            if (dVar14 < dVar10) {
              dVar14 = scalar[iVar2];
              dVar13 = (scalar[iVar4] - dVar14) * local_88 +
                       (scalar[iVar1] - dVar14) * local_48 + (scalar[iVar3] - dVar14) * local_68;
              dVar14 = dVar13;
              if (dVar13 <= -dVar13) {
                dVar14 = -dVar13;
              }
              if (dVar14 < dVar10) {
                auVar8._8_8_ = dVar9;
                auVar5._8_8_ = local_38;
                auVar5._0_8_ = local_38;
                auVar12 = divpd(auVar8,auVar5);
                *(undefined1 (*) [16])gradient = auVar12;
                gradient[2] = dVar13 / local_38;
                return 0;
              }
            }
          }
          *gradient = 0.0;
          gradient[1] = 0.0;
          gradient[2] = 0.0;
          return 4;
        }
        uVar7 = 0xcad;
      }
      else {
        uVar7 = 0xca8;
      }
    }
    else {
      uVar7 = 0xca3;
    }
  }
  else {
    uVar7 = 0xc9d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_tet_grad_nodes",(ulong)uVar6,"vol");
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_INT face[3];

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tet_vol(ref_node, nodes, &vol), "vol");
  vol *= -6.0;

  face[0] = nodes[0];
  face[1] = nodes[3];
  face[2] = nodes[2];
  RSS(ref_node_tri_normal(ref_node, face, norm1), "vol");

  face[0] = nodes[0];
  face[1] = nodes[1];
  face[2] = nodes[3];
  RSS(ref_node_tri_normal(ref_node, face, norm2), "vol");

  face[0] = nodes[0];
  face[1] = nodes[2];
  face[2] = nodes[1];
  RSS(ref_node_tri_normal(ref_node, face, norm3), "vol");

  gradient[0] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[0] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[0] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[0];
  gradient[1] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[1] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[1] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[1];
  gradient[2] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[2] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[2] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}